

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_io.cpp
# Opt level: O0

int main(void)

{
  initializer_list<unsigned_long> __l;
  MakeNet *pMVar1;
  allocator<unsigned_long> *this;
  void *__buf;
  PlainTextNetworkWriter local_300;
  PlainTextNetworkReader local_2f8;
  undefined1 local_2f0 [8];
  Net mlp_copy;
  undefined8 local_2b8;
  string local_2b0 [32];
  PlainTextNetworkWriter local_290;
  stringstream local_288 [8];
  stringstream ss;
  ostream local_278 [376];
  function<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
  local_100;
  allocator<unsigned_long> local_c9;
  unsigned_long local_c8 [4];
  iterator local_a8;
  size_type local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  MakeNet local_80;
  undefined1 local_38 [8];
  Net mlp;
  
  notch::core::MakeNet::MakeNet(&local_80,0);
  local_c8[0] = 2;
  local_c8[1] = 2;
  local_c8[2] = 1;
  local_a8 = local_c8;
  local_a0 = 3;
  this = &local_c9;
  notch::core::std::allocator<unsigned_long>::allocator(this);
  __l._M_len = local_a0;
  __l._M_array = local_a8;
  notch::core::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_98,__l,this);
  pMVar1 = notch::core::MakeNet::MultilayerPerceptron
                     (&local_80,&local_98,(Activation *)notch::core::scaledTanh);
  pMVar1 = notch::core::MakeNet::addL2Loss(pMVar1);
  std::
  function<void(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,std::default_delete<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>>&,std::valarray<float>&,int,int)>
  ::
  function<void(&)(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,std::default_delete<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>>&,std::valarray<float>&,int,int),void>
            ((function<void(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,std::default_delete<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>>&,std::valarray<float>&,int,int)>
              *)&local_100,notch::core::Init::normalXavier);
  notch::core::MakeNet::init((MakeNet *)local_38,(EVP_PKEY_CTX *)pMVar1);
  notch::core::std::
  function<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
  ::~function(&local_100);
  notch::core::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_98);
  notch::core::std::allocator<unsigned_long>::~allocator(&local_c9);
  notch::core::MakeNet::~MakeNet(&local_80);
  std::__cxx11::stringstream::stringstream(local_288);
  notch::io::PlainTextNetworkWriter::PlainTextNetworkWriter(&local_290,local_278);
  notch::io::PlainTextNetworkWriter::operator<<(&local_290,(Net *)local_38);
  std::operator<<((ostream *)&std::cout,"saved:\n\n```\n");
  std::__cxx11::stringstream::str();
  std::operator<<((ostream *)&std::cout,local_2b0);
  std::__cxx11::string::~string(local_2b0);
  std::operator<<((ostream *)&std::cout,"```\n\n");
  notch::core::std::fpos<__mbstate_t>::fpos
            ((fpos<__mbstate_t> *)
             &mlp_copy.lossLayer.
              super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,0)
  ;
  std::istream::seekg(local_288,
                      mlp_copy.lossLayer.
                      super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi,local_2b8);
  notch::io::PlainTextNetworkReader::PlainTextNetworkReader(&local_2f8,(istream *)local_288);
  notch::io::PlainTextNetworkReader::read
            ((PlainTextNetworkReader *)local_2f0,(int)&local_2f8,__buf,(size_t)this);
  std::operator<<((ostream *)&std::cout,"loaded:\n\n```\n");
  notch::io::PlainTextNetworkWriter::PlainTextNetworkWriter(&local_300,(ostream *)&std::cout);
  notch::io::PlainTextNetworkWriter::operator<<(&local_300,(Net *)local_2f0);
  std::operator<<((ostream *)&std::cout,"```\n\n");
  notch::core::Net::~Net((Net *)local_2f0);
  std::__cxx11::stringstream::~stringstream(local_288);
  notch::core::Net::~Net((Net *)local_38);
  return 0;
}

Assistant:

int main() {

    // create a multilayer perceptron and save it to a string stream
    Net mlp = MakeNet().MultilayerPerceptron({2, 2, 1}).addL2Loss().init();
    stringstream ss;
    PlainTextNetworkWriter(ss) << mlp;

    // show original
    cout << "saved:\n\n```\n";
    cout << ss.str();
    cout << "```\n\n";

    // read a copy of the multilayer perceptron from the string stream
    ss.seekg(0);
    Net mlp_copy = PlainTextNetworkReader(ss).read();

    // show a copy
    cout << "loaded:\n\n```\n";
    PlainTextNetworkWriter(cout) << mlp_copy;
    cout << "```\n\n";
}